

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintStamp.cpp
# Opt level: O3

void __thiscall OpenMD::RestraintStamp::validate(RestraintStamp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  pointer pcVar3;
  bool bVar4;
  EqualIgnoreCaseConstraint local_210;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> local_1d0;
  EqualIgnoreCaseConstraint local_130;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  DataHolder::validate(&this->super_DataHolder);
  if ((this->Type).super_ParameterBase.empty_ == false) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Object","");
    isEqualIgnoreCase(&local_210,&local_70);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Molecular","");
    isEqualIgnoreCase(&local_130,&local_90);
    OpenMD::operator||(&local_1d0,
                       &local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                       &local_130.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
    pcVar3 = (this->Type).data_._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar3,pcVar3 + (this->Type).data_._M_string_length);
    bVar4 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
            operator()((OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>
                        *)&local_1d0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.cons2_.rhs_._M_dataplus._M_p != &local_1d0.cons2_.rhs_.field_2) {
      operator_delete(local_1d0.cons2_.rhs_._M_dataplus._M_p,
                      local_1d0.cons2_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_1d0.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_1d0.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_1d0.cons2_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.cons1_.rhs_._M_dataplus._M_p != &local_1d0.cons1_.rhs_.field_2) {
      operator_delete(local_1d0.cons1_.rhs_._M_dataplus._M_p,
                      local_1d0.cons1_.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_._M_dataplus._M_p !=
        &local_1d0.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
         description_.field_2) {
      operator_delete(local_1d0.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      _M_dataplus._M_p,
                      local_1d0.cons1_.
                      super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                      field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p !=
        &local_1d0.
         super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
         .description_.field_2) {
      operator_delete(local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.rhs_._M_dataplus._M_p != &local_130.rhs_.field_2) {
      operator_delete(local_130.rhs_._M_dataplus._M_p,
                      local_130.rhs_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p !=
        &local_130.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
         field_2) {
      operator_delete(local_130.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_130.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.rhs_._M_dataplus._M_p != &local_210.rhs_.field_2) {
      operator_delete(local_210.rhs_._M_dataplus._M_p,
                      local_210.rhs_.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
              field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           _M_dataplus._M_p != paVar1) {
      operator_delete(local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_._M_dataplus._M_p,
                      local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                      description_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      pcVar3 = (this->Type).super_ParameterBase.keyword_._M_dataplus._M_p;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Object","");
      isEqualIgnoreCase(&local_210,&local_d0);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Molecular","");
      isEqualIgnoreCase(&local_130,&local_f0);
      OpenMD::operator||(&local_1d0,
                         &local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>,
                         &local_130.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,
                 local_1d0.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p,
                 local_1d0.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_dataplus._M_p +
                 local_1d0.
                 super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                 .description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.cons2_.rhs_._M_dataplus._M_p != &local_1d0.cons2_.rhs_.field_2) {
        operator_delete(local_1d0.cons2_.rhs_._M_dataplus._M_p,
                        local_1d0.cons2_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_1d0.cons2_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_1d0.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_1d0.cons2_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.cons1_.rhs_._M_dataplus._M_p != &local_1d0.cons1_.rhs_.field_2) {
        operator_delete(local_1d0.cons1_.rhs_._M_dataplus._M_p,
                        local_1d0.cons1_.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
             description_._M_dataplus._M_p !=
          &local_1d0.cons1_.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
           description_.field_2) {
        operator_delete(local_1d0.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        _M_dataplus._M_p,
                        local_1d0.cons1_.
                        super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
                        field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p !=
          &local_1d0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_.field_2) {
        operator_delete(local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.rhs_._M_dataplus._M_p != &local_130.rhs_.field_2) {
        operator_delete(local_130.rhs_._M_dataplus._M_p,
                        local_130.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_130.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_130.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_130.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.rhs_._M_dataplus._M_p != &local_210.rhs_.field_2) {
        operator_delete(local_210.rhs_._M_dataplus._M_p,
                        local_210.rhs_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p != paVar1) {
        operator_delete(local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->DisplacementSpringConstant).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar2 = (this->DisplacementSpringConstant).data_;
    paVar1 = &local_1d0.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if (dVar2 < 0.0) {
      pcVar3 = (this->DisplacementSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      local_1d0.
      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
      .description_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_dataplus._M_p,
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_dataplus._M_p +
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_1d0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->AbsoluteSpringConstant).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar2 = (this->AbsoluteSpringConstant).data_;
    paVar1 = &local_1d0.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if (dVar2 < 0.0) {
      pcVar3 = (this->AbsoluteSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      local_1d0.
      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
      .description_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_dataplus._M_p,
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_dataplus._M_p +
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_1d0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->TwistSpringConstant).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar2 = (this->TwistSpringConstant).data_;
    paVar1 = &local_1d0.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if (dVar2 < 0.0) {
      pcVar3 = (this->TwistSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      local_1d0.
      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
      .description_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_dataplus._M_p,
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_dataplus._M_p +
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_1d0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->SwingXSpringConstant).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar2 = (this->SwingXSpringConstant).data_;
    paVar1 = &local_1d0.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if (dVar2 < 0.0) {
      pcVar3 = (this->SwingXSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      local_1d0.
      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
      .description_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_dataplus._M_p,
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_dataplus._M_p +
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_1d0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  if ((this->SwingYSpringConstant).super_ParameterBase.empty_ == false) {
    isNonNegative();
    dVar2 = (this->SwingYSpringConstant).data_;
    paVar1 = &local_1d0.
              super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
              .description_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.
           super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
           .description_._M_dataplus._M_p != paVar1) {
      operator_delete(local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_._M_dataplus._M_p,
                      local_1d0.
                      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                      .description_.field_2._M_allocated_capacity + 1);
    }
    if (dVar2 < 0.0) {
      pcVar3 = (this->SwingYSpringConstant).super_ParameterBase.keyword_._M_dataplus._M_p;
      isNonNegative();
      local_1d0.
      super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
      .description_._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d0,
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_dataplus._M_p,
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_dataplus._M_p +
                 local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                 description_._M_string_length);
      snprintf(painCave.errMsg,2000,"Error in checking %s : should be %s\n",pcVar3,
               local_1d0.
               super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
               .description_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.
             super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
             .description_._M_dataplus._M_p != paVar1) {
        operator_delete(local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_._M_dataplus._M_p,
                        local_1d0.
                        super_ParamConstraintFacade<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>_>
                        .description_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
             _M_dataplus._M_p !=
          &local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.description_.
           field_2) {
        operator_delete(local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_._M_dataplus._M_p,
                        local_210.super_ParamConstraintFacade<OpenMD::EqualIgnoreCaseConstraint>.
                        description_.field_2._M_allocated_capacity + 1);
      }
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
  }
  return;
}

Assistant:

void RestraintStamp::validate() {
    DataHolder::validate();
    CheckParameter(
        Type, isEqualIgnoreCase("Object") || isEqualIgnoreCase("Molecular"));
    CheckParameter(DisplacementSpringConstant, isNonNegative());
    CheckParameter(AbsoluteSpringConstant, isNonNegative());
    CheckParameter(TwistSpringConstant, isNonNegative());
    CheckParameter(SwingXSpringConstant, isNonNegative());
    CheckParameter(SwingYSpringConstant, isNonNegative());
    // CheckParameter(MolIndex, isNonNegative());
  }